

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void ProcessThread::addPid(pid_t pid,Process *process,bool async)

{
  _Atomic_word *p_Var1;
  Process *this;
  int iVar2;
  iterator __it;
  Event *event;
  mapped_type *pmVar3;
  pid_t local_64;
  Process *local_60;
  __weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  local_64 = pid;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&sProcessMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  sPending = sPending + -1;
  if (sPendingPids._M_h._M_element_count != 0) {
    __it = std::
           _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&sPendingPids._M_h,&local_64);
    if (__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
        (__node_type *)0x0) {
      iVar2 = *(int *)((long)__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur
                      + 0xc);
      if (async) {
        EventLoop::eventLoop();
        this = local_60;
        event = (Event *)operator_new(0x20);
        event->_vptr_Event = (_func_int **)&PTR__Event_001907c0;
        event[1]._vptr_Event = (_func_int **)process;
        *(int *)&event[2]._vptr_Event = iVar2;
        EventLoop::post((EventLoop *)this,event);
        if (local_58._M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_ptr);
        }
      }
      else {
        Process::finish(process,iVar2);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&sPendingPids._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur);
      goto LAB_00170674;
    }
  }
  local_60 = process;
  if (async) {
    EventLoop::eventLoop();
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_40->_M_weak_count = p_Stack_40->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_40->_M_weak_count = p_Stack_40->_M_weak_count + 1;
      }
    }
  }
  else {
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  local_58._M_ptr = local_48;
  local_58._M_refcount._M_pi = p_Stack_40;
  pmVar3 = std::
           map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
           ::operator[](&sProcesses,&local_64);
  pmVar3->proc = local_60;
  std::__weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar3->loop).super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>,&local_58);
  if (local_58._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_58._M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_58._M_refcount._M_pi)->_M_weak_count;
      (local_58._M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_58._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
LAB_00170674:
  if (sPending == 0) {
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&sPendingPids._M_h);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&sProcessMutex);
  return;
}

Assistant:

void ProcessThread::addPid(pid_t pid, Process* process, bool async)
{
    std::lock_guard<std::mutex> lock(sProcessMutex);
    sPending -= 1;

    if (!sPendingPids.empty()) {
        // we have to check
        auto it = sPendingPids.find(pid);
        if (it != sPendingPids.end()) {
            // fire the signal now
            const int ret = it->second;
            if (async) {
                EventLoop::eventLoop()->callLater([process, ret]() { process->finish(ret); });
            } else {
                process->finish(ret);
            }
            sPendingPids.erase(it);
            if (!sPending)
                sPendingPids.clear();
            return;
        }
    }

    sProcesses[pid] = { process, async ? EventLoop::eventLoop() : EventLoop::SharedPtr() };

    if (!sPending)
        sPendingPids.clear();
}